

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Reference> *value)

{
  bool bVar1;
  undefined1 local_178 [8];
  Reference v;
  optional<tinyusdz::Reference> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Reference>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    Reference::Reference((Reference *)local_178);
    this_local._7_1_ = ReadBasicType(this,(Reference *)local_178);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::Reference>::operator=(value,(Reference *)local_178);
    }
    Reference::~Reference((Reference *)local_178);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Reference> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Reference v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}